

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void new_ascii_string(vm_val_t *ret,char *str)

{
  char *in_RSI;
  char *in_RDI;
  vm_val_t *unaff_retaddr;
  
  strlen(in_RSI);
  new_ascii_string(unaff_retaddr,in_RDI,(size_t)in_RSI);
  return;
}

Assistant:

static void new_ascii_string(VMG_ vm_val_t *ret, const char *str)
{
    return new_ascii_string(vmg_ ret, str, strlen(str));
}